

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseBuilder::embedDataArray
          (BaseBuilder *this,uint32_t typeId,void *data,size_t itemCount,size_t itemRepeat)

{
  Error EVar1;
  EmbedDataNode *in_RAX;
  EmbedDataNode *node;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar1 = 5;
  }
  else {
    node = in_RAX;
    EVar1 = _newEmbedDataNode(this,&node,typeId,data,itemCount,itemRepeat);
    if (EVar1 == 0) {
      addNode(this,&node->super_BaseNode);
    }
  }
  return EVar1;
}

Assistant:

Error BaseBuilder::embedDataArray(uint32_t typeId, const void* data, size_t itemCount, size_t itemRepeat) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(_newEmbedDataNode(&node, typeId, data, itemCount, itemRepeat));

  addNode(node);
  return kErrorOk;
}